

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

bool __thiscall File::isEmpty(File *this)

{
  int iVar1;
  stat s;
  stat sStack_98;
  
  iVar1 = fileno((FILE *)this->stream);
  iVar1 = fstat(iVar1,&sStack_98);
  if (iVar1 != 0) {
    this->valid = false;
  }
  return iVar1 == 0 && sStack_98.st_size == 0;
}

Assistant:

bool File::isEmpty()
{
#ifndef _WIN32
	struct stat s;

	if (fstat(fileno(stream), &s) != 0)
	{
		valid = false;

		return false;
	}

	return (s.st_size == 0);
#else
	struct _stat s;

	if (_fstat(_fileno(stream), &s) != 0)
	{
		valid = false;

		return false;
	}

	return (s.st_size == 0);
#endif
}